

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChObjFileShape.cpp
# Opt level: O3

void __thiscall chrono::ChObjFileShape::ArchiveOUT(ChObjFileShape *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChObjFileShape>(marchive);
  ChVisualShape::ArchiveOUT(&this->super_ChVisualShape,marchive);
  (*(marchive->super_ChArchive)._vptr_ChArchive[8])(marchive);
  return;
}

Assistant:

void ChObjFileShape::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChObjFileShape>();
    // serialize parent class
    ChVisualShape::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(filename);
}